

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

yyjson_mut_doc * duckdb_yyjson::yyjson_mut_doc_mut_copy(yyjson_mut_doc *doc,yyjson_alc *alc)

{
  yyjson_mut_doc *doc_00;
  yyjson_mut_val *pyVar1;
  
  if (doc != (yyjson_mut_doc *)0x0) {
    pyVar1 = doc->root;
    doc_00 = yyjson_mut_doc_new(alc);
    if (pyVar1 == (yyjson_mut_val *)0x0) {
      return doc_00;
    }
    if (doc_00 != (yyjson_mut_doc *)0x0) {
      pyVar1 = yyjson_mut_val_mut_copy(doc_00,doc->root);
      if (pyVar1 != (yyjson_mut_val *)0x0) {
        doc_00->root = pyVar1;
        return doc_00;
      }
      yyjson_mut_doc_free(doc_00);
    }
  }
  return (yyjson_mut_doc *)0x0;
}

Assistant:

yyjson_mut_doc *yyjson_mut_doc_mut_copy(yyjson_mut_doc *doc,
                                        const yyjson_alc *alc) {
    yyjson_mut_doc *m_doc;
    yyjson_mut_val *m_val;

    if (!doc) return NULL;
    if (!doc->root) return yyjson_mut_doc_new(alc);

    m_doc = yyjson_mut_doc_new(alc);
    if (!m_doc) return NULL;
    m_val = yyjson_mut_val_mut_copy(m_doc, doc->root);
    if (!m_val) {
        yyjson_mut_doc_free(m_doc);
        return NULL;
    }
    yyjson_mut_doc_set_root(m_doc, m_val);
    return m_doc;
}